

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

char * ecc_cache_str_shared(char *curve_name,mp_int *x,mp_int *y)

{
  strbuf *buf_o;
  char *pcVar1;
  char *ptr;
  
  buf_o = strbuf_new();
  if (curve_name != (char *)0x0) {
    BinarySink_put_fmt(buf_o->binarysink_,"%s,",curve_name);
  }
  pcVar1 = mp_get_hex(x);
  ptr = mp_get_hex(y);
  BinarySink_put_fmt(buf_o->binarysink_,"0x%s,0x%s",pcVar1,ptr);
  safefree(pcVar1);
  safefree(ptr);
  pcVar1 = strbuf_to_str(buf_o);
  return pcVar1;
}

Assistant:

static char *ecc_cache_str_shared(
    const char *curve_name, mp_int *x, mp_int *y)
{
    strbuf *sb = strbuf_new();

    if (curve_name)
        put_fmt(sb, "%s,", curve_name);

    char *hx = mp_get_hex(x);
    char *hy = mp_get_hex(y);
    put_fmt(sb, "0x%s,0x%s", hx, hy);
    sfree(hx);
    sfree(hy);

    return strbuf_to_str(sb);
}